

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O3

char * poptBadOption(poptContext con,uint flags)

{
  if (con == (poptContext)0x0) {
    return (char *)0x0;
  }
  if (con->execFail != (char *)0x0) {
    return con->execFail;
  }
  if ((flags & 1) == 0) {
    con = (poptContext)con->os;
  }
  return con->optionStack[0].argv[(long)con->optionStack[0].next + -1];
}

Assistant:

const char * poptBadOption(poptContext con, unsigned int flags)
{
    struct optionStackEntry * os = NULL;
    const char *badOpt = NULL;

    if (con != NULL) {
       /* Stupid hack to return something semi-meaningful from exec failure */
       if (con->execFail) {
           badOpt = con->execFail;
       } else {
           os = (flags & POPT_BADOPTION_NOALIAS) ? con->optionStack : con->os;
           badOpt = os->argv[os->next - 1];
       }
    }

    return badOpt;
}